

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_get_num_files.c
# Opt level: O0

int zip_get_num_files(zip_t *za)

{
  zip_t *za_local;
  
  if (za == (zip_t *)0x0) {
    za_local._4_4_ = -1;
  }
  else if (za->nentry < 0x80000000) {
    za_local._4_4_ = (int)za->nentry;
  }
  else {
    zip_error_set(&za->error,0x1c,0);
    za_local._4_4_ = -1;
  }
  return za_local._4_4_;
}

Assistant:

ZIP_EXTERN int
zip_get_num_files(zip_t *za) {
    if (za == NULL)
	return -1;

    if (za->nentry > INT_MAX) {
	zip_error_set(&za->error, ZIP_ER_OPNOTSUPP, 0);
	return -1;
    }

    return (int)za->nentry;
}